

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_compiler_hlsl_add_vertex_attribute_remap
          (spvc_compiler compiler,spvc_hlsl_vertex_attribute_remap *remap,size_t count)

{
  spvc_context_s *this;
  CompilerHLSL *this_00;
  ulong local_98;
  size_t i;
  CompilerHLSL *hlsl;
  HLSLVertexAttributeRemap re;
  allocator local_49;
  string local_48;
  size_t local_28;
  size_t count_local;
  spvc_hlsl_vertex_attribute_remap *remap_local;
  spvc_compiler compiler_local;
  
  local_28 = count;
  count_local = (size_t)remap;
  remap_local = (spvc_hlsl_vertex_attribute_remap *)compiler;
  if (compiler->backend == SPVC_BACKEND_HLSL) {
    spirv_cross::HLSLVertexAttributeRemap::HLSLVertexAttributeRemap
              ((HLSLVertexAttributeRemap *)&hlsl);
    this_00 = (CompilerHLSL *)
              std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
              get((unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_> *)
                  (remap_local + 1));
    for (local_98 = 0; local_98 < local_28; local_98 = local_98 + 1) {
      hlsl._0_4_ = *(undefined4 *)(count_local + local_98 * 0x10);
      std::__cxx11::string::operator=((string *)&re,*(char **)(count_local + 8 + local_98 * 0x10));
      spirv_cross::CompilerHLSL::add_vertex_attribute_remap
                (this_00,(HLSLVertexAttributeRemap *)&hlsl);
    }
    compiler_local._4_4_ = SPVC_SUCCESS;
    spirv_cross::HLSLVertexAttributeRemap::~HLSLVertexAttributeRemap
              ((HLSLVertexAttributeRemap *)&hlsl);
  }
  else {
    this = compiler->context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"HLSL function used on a non-HLSL backend.",&local_49);
    spvc_context_s::report_error(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    compiler_local._4_4_ = SPVC_ERROR_INVALID_ARGUMENT;
  }
  return compiler_local._4_4_;
}

Assistant:

spvc_result spvc_compiler_hlsl_add_vertex_attribute_remap(spvc_compiler compiler,
                                                          const spvc_hlsl_vertex_attribute_remap *remap,
                                                          size_t count)
{
#if SPIRV_CROSS_C_API_HLSL
	if (compiler->backend != SPVC_BACKEND_HLSL)
	{
		compiler->context->report_error("HLSL function used on a non-HLSL backend.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	HLSLVertexAttributeRemap re;
	auto &hlsl = *static_cast<CompilerHLSL *>(compiler->compiler.get());
	for (size_t i = 0; i < count; i++)
	{
		re.location = remap[i].location;
		re.semantic = remap[i].semantic;
		hlsl.add_vertex_attribute_remap(re);
	}

	return SPVC_SUCCESS;
#else
	(void)remap;
	(void)count;
	compiler->context->report_error("HLSL function used on a non-HLSL backend.");
	return SPVC_ERROR_INVALID_ARGUMENT;
#endif
}